

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall
spv::Builder::createLoopMerge(Builder *this,Block *mergeBlock,Block *continueBlock,uint control)

{
  Block *this_00;
  Id IVar1;
  Instruction *pIVar2;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_48 [3];
  Instruction *local_30;
  Instruction *merge;
  Block *pBStack_20;
  uint control_local;
  Block *continueBlock_local;
  Block *mergeBlock_local;
  Builder *this_local;
  
  merge._4_4_ = control;
  pBStack_20 = continueBlock;
  continueBlock_local = mergeBlock;
  mergeBlock_local = (Block *)this;
  pIVar2 = (Instruction *)Instruction::operator_new((Instruction *)0x38,(size_t)mergeBlock);
  Instruction::Instruction(pIVar2,OpLoopMerge);
  local_30 = pIVar2;
  IVar1 = Block::getId(continueBlock_local);
  Instruction::addIdOperand(pIVar2,IVar1);
  pIVar2 = local_30;
  IVar1 = Block::getId(pBStack_20);
  Instruction::addIdOperand(pIVar2,IVar1);
  Instruction::addImmediateOperand(local_30,merge._4_4_);
  this_00 = this->buildPoint;
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)local_48,local_30
            );
  Block::addInstruction(this_00,local_48);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(local_48);
  return;
}

Assistant:

void Builder::createLoopMerge(Block* mergeBlock, Block* continueBlock, unsigned int control)
{
    Instruction* merge = new Instruction(OpLoopMerge);
    merge->addIdOperand(mergeBlock->getId());
    merge->addIdOperand(continueBlock->getId());
    merge->addImmediateOperand(control);
    buildPoint->addInstruction(std::unique_ptr<Instruction>(merge));
}